

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rk_function.hpp
# Opt level: O2

vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
* __thiscall
cvs_rk::rk_function<9223372036854775783UL>::to_mod_vector
          (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
           *__return_storage_ptr__,rk_function<9223372036854775783UL> *this,string *S)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pmVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulint uVar10;
  ulong uVar11;
  size_type sVar12;
  allocator_type local_41;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *local_40;
  rk_function<9223372036854775783UL> *local_38;
  
  local_38 = this;
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector(__return_storage_ptr__,S->_M_string_length,&local_41);
  pcVar1 = (S->_M_dataplus)._M_p;
  sVar2 = S->_M_string_length;
  pmVar3 = (__return_storage_ptr__->
           super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = 1;
  local_40 = __return_storage_ptr__;
  for (sVar12 = 0; sVar2 != sVar12; sVar12 = sVar12 + 1) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)pcVar1[sVar12];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = SUB168(auVar4 % ZEXT816(0x7fffffffffffffe7),0);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar11 % 0x7fffffffffffffe7;
    uVar10 = __umodti3(SUB168(auVar6 * auVar8,0),SUB168(auVar6 * auVar8,8),0x7fffffffffffffe7,0);
    pmVar3[sVar12].val = uVar10;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (local_38->sigma).val;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SUB168(auVar5 % ZEXT816(0x7fffffffffffffe7),0);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar11 % 0x7fffffffffffffe7;
    uVar11 = __umodti3(SUB168(auVar7 * auVar9,0),SUB168(auVar7 * auVar9,8),0x7fffffffffffffe7,0);
  }
  return local_40;
}

Assistant:

vector<mod_int_t> to_mod_vector(string& S){

		mod_int_t coefficient = 1;

		auto result = vector<mod_int_t>(S.length());
		ulint i = 0;

		for(auto c : S){

			result[i++] = mod_int_t(c) * coefficient;
			coefficient = coefficient * sigma;

		}

		return result;

	}